

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluPrintConfig(int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong local_20;
  
  local_20 = BStruth;
  if ((nVars - g->nVars) + (uint)('\x02' < g->nMyu) + 1 != (int)r->nVars) {
    __assert_fail("r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                  ,0x250,"void If_CluPrintConfig(int, If_Grp_t *, If_Grp_t *, word, word *)");
  }
  If_CluPrintGroup(g);
  bVar1 = g->nVars;
  iVar4 = (int)(char)bVar1;
  if (iVar4 < 6) {
    if (6 < bVar1) goto LAB_00382bd8;
    bVar2 = (byte)(1L << (bVar1 & 0x3f));
    uVar6 = ~(-1L << (bVar2 & 0x3f)) & local_20;
    uVar3 = 0;
    uVar8 = uVar6 << (bVar2 & 0x3f);
    if (bVar1 != 0) {
      uVar8 = uVar3;
    }
    uVar8 = uVar8 | uVar6;
    uVar6 = uVar8 * 4;
    if (1 < bVar1) {
      uVar6 = uVar3;
    }
    iVar5 = 2;
    if (1 < bVar1) {
      iVar5 = iVar4 + (uint)(iVar4 == 0);
    }
    uVar6 = uVar6 | uVar8;
    uVar8 = uVar6 << 4;
    if (iVar5 != 2) {
      uVar8 = uVar3;
    }
    iVar7 = 3;
    if (iVar5 != 2) {
      iVar7 = iVar5;
    }
    uVar8 = uVar8 | uVar6;
    uVar6 = uVar8 << 8;
    if (iVar7 != 3) {
      uVar6 = uVar3;
    }
    uVar6 = uVar6 | uVar8;
    uVar8 = uVar6 << 0x10;
    if (1 < iVar7 - 3U) {
      uVar8 = uVar3;
    }
    uVar8 = uVar8 | uVar6;
    local_20 = uVar8 << 0x20 | uVar8;
  }
  Kit_DsdPrintFromTruth((uint *)&local_20,iVar4);
  putchar(10);
  If_CluPrintGroup(r);
  bVar1 = r->nVars;
  iVar4 = (int)(char)bVar1;
  if (iVar4 < 6) {
    if (6 < bVar1) {
LAB_00382bd8:
      __assert_fail("nVars >= 0 && nVars <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                    ,0x174,"word If_CluAdjust(word, int)");
    }
    bVar2 = (byte)(1L << (bVar1 & 0x3f));
    uVar6 = ~(-1L << (bVar2 & 0x3f)) & *pFStruth;
    uVar3 = 0;
    uVar8 = uVar6 << (bVar2 & 0x3f);
    if (bVar1 != 0) {
      uVar8 = uVar3;
    }
    uVar8 = uVar8 | uVar6;
    uVar6 = uVar8 * 4;
    if (1 < bVar1) {
      uVar6 = uVar3;
    }
    iVar5 = 2;
    if (1 < bVar1) {
      iVar5 = iVar4 + (uint)(iVar4 == 0);
    }
    uVar6 = uVar6 | uVar8;
    uVar8 = uVar6 << 4;
    if (iVar5 != 2) {
      uVar8 = uVar3;
    }
    iVar7 = 3;
    if (iVar5 != 2) {
      iVar7 = iVar5;
    }
    uVar8 = uVar8 | uVar6;
    uVar6 = uVar8 << 8;
    if (iVar7 != 3) {
      uVar6 = uVar3;
    }
    uVar6 = uVar6 | uVar8;
    uVar8 = uVar6 << 0x10;
    if (1 < iVar7 - 3U) {
      uVar8 = uVar3;
    }
    uVar8 = uVar8 | uVar6;
    *pFStruth = uVar8 << 0x20 | uVar8;
  }
  Kit_DsdPrintFromTruth((uint *)pFStruth,iVar4);
  putchar(10);
  return;
}

Assistant:

void If_CluPrintConfig( int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    assert( r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2) );
    If_CluPrintGroup( g );
    if ( g->nVars < 6 )
        BStruth = If_CluAdjust( BStruth, g->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)&BStruth, g->nVars );
    printf( "\n" );
    If_CluPrintGroup( r );
    if ( r->nVars < 6 )
        pFStruth[0] = If_CluAdjust( pFStruth[0], r->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)pFStruth, r->nVars );
    printf( "\n" );
}